

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithConstPointerParameter_Test::
~TEST_MockExpectedCall_callWithConstPointerParameter_Test
          (TEST_MockExpectedCall_callWithConstPointerParameter_Test *this)

{
  TEST_MockExpectedCall_callWithConstPointerParameter_Test *this_local;
  
  ~TEST_MockExpectedCall_callWithConstPointerParameter_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithConstPointerParameter)
{
    const SimpleString paramName = "paramName";
    const void* value = (const void*) 0x345;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("const void*", call->getInputParameterType(paramName).asCharString());
    POINTERS_EQUAL(value, call->getInputParameter(paramName).getConstPointerValue());
    STRCMP_CONTAINS("funcName -> const void* paramName: <0x345>", call->callToString().asCharString());
}